

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.cpp
# Opt level: O0

void __thiscall zmq::dist_t::reverse_match(dist_t *this)

{
  dist_t *in_RDI;
  size_type unaff_retaddr;
  size_type in_stack_00000008;
  size_type i;
  size_type prev_matching;
  ulong local_18;
  
  local_18 = in_RDI->_matching;
  unmatch(in_RDI);
  for (; local_18 < in_RDI->_eligible; local_18 = local_18 + 1) {
    in_RDI->_matching = in_RDI->_matching + 1;
    array_t<zmq::pipe_t,_2>::swap((array_t<zmq::pipe_t,_2> *)i,in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

void zmq::dist_t::reverse_match ()
{
    const pipes_t::size_type prev_matching = _matching;

    // Reset matching to 0
    unmatch ();

    // Mark all matching pipes as not matching and vice-versa.
    // To do this, push all pipes that are eligible but not
    // matched - i.e. between "matching" and "eligible" -
    // to the beginning of the queue.
    for (pipes_t::size_type i = prev_matching; i < _eligible; ++i) {
        _pipes.swap (i, _matching++);
    }
}